

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

void __thiscall
pybind11::exception<kratos::StmtException>::exception
          (exception<kratos::StmtException> *this,handle scope,char *name,handle base)

{
  bool bVar1;
  int iVar2;
  detail *this_00;
  undefined8 *puVar3;
  long *plVar4;
  PyObject *pPVar5;
  size_type *psVar6;
  handle *handle;
  undefined8 uVar7;
  ulong uVar8;
  accessor<pybind11::detail::accessor_policies::str_attr> local_e0;
  size_type *local_c0;
  string full_name;
  char *name_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  
  (this->super_object).super_handle.m_ptr = (PyObject *)0x0;
  local_e0.key = "__name__";
  local_e0.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
  local_e0.obj.m_ptr = scope.m_ptr;
  full_name.field_2._8_8_ = name;
  this_00 = (detail *)
            detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache(&local_e0);
  detail::load_type<std::__cxx11::string>
            ((make_caster<std::__cxx11::basic_string<char>_> *)local_50,this_00,handle);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  if ((undefined1 *)local_50._0_8_ == local_40) {
    local_70.field_2._8_4_ = local_40._8_4_;
    local_70.field_2._12_4_ = local_40._12_4_;
  }
  else {
    local_70._M_dataplus._M_p = (pointer)local_50._0_8_;
  }
  local_70.field_2._M_allocated_capacity = local_40._0_8_;
  local_70._M_string_length = local_50._8_8_;
  local_50._0_8_ = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,".","");
  uVar7 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    uVar7 = local_70.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar7 < local_50._8_8_ + local_70._M_string_length) {
    uVar8 = 0xf;
    if ((undefined1 *)local_50._0_8_ != local_40) {
      uVar8 = local_40._0_8_;
    }
    if (local_50._8_8_ + local_70._M_string_length <= uVar8) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)local_50,0,(char *)0x0,(ulong)local_70._M_dataplus._M_p);
      goto LAB_002e72f6;
    }
  }
  puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,local_50._0_8_);
LAB_002e72f6:
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  psVar6 = puVar3 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_90.field_2._M_allocated_capacity = *psVar6;
    local_90.field_2._8_8_ = puVar3[3];
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar6;
    local_90._M_dataplus._M_p = (pointer)*puVar3;
  }
  local_90._M_string_length = puVar3[1];
  *puVar3 = psVar6;
  puVar3[1] = 0;
  *(undefined1 *)psVar6 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
  local_c0 = &full_name._M_string_length;
  psVar6 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar6) {
    full_name._M_string_length = *psVar6;
    full_name.field_2._M_allocated_capacity = plVar4[3];
  }
  else {
    full_name._M_string_length = *psVar6;
    local_c0 = (size_type *)*plVar4;
  }
  full_name._M_dataplus._M_p = (pointer)plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_50._0_8_ != local_40) {
    operator_delete((void *)local_50._0_8_,local_40._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  object::~object(&local_e0.cache);
  pPVar5 = (PyObject *)PyErr_NewException(local_c0,base.m_ptr,0);
  (this->super_object).super_handle.m_ptr = pPVar5;
  iVar2 = PyObject_HasAttrString(scope.m_ptr,"__dict__");
  if (iVar2 == 1) {
    local_40._0_8_ = "__dict__";
    local_40._8_8_ = 0;
    local_50._8_8_ = scope.m_ptr;
    bVar1 = detail::
            object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>::
            contains<char_const*&>
                      ((object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>
                        *)local_50,(char **)((long)&full_name.field_2 + 8));
    object::~object((object *)(local_40 + 8));
    name = (char *)full_name.field_2._8_8_;
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,(char *)full_name.field_2._8_8_,(allocator<char> *)&local_e0);
      std::operator+(&local_90,
                     "Error during initialization: multiple incompatible definitions with name \"",
                     &local_70);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
      local_50._0_8_ = *plVar4;
      psVar6 = (size_type *)(plVar4 + 2);
      if ((size_type *)local_50._0_8_ == psVar6) {
        local_40._0_8_ = *psVar6;
        local_40._8_8_ = plVar4[3];
        local_50._0_8_ = local_40;
      }
      else {
        local_40._0_8_ = *psVar6;
      }
      local_50._8_8_ = plVar4[1];
      *plVar4 = (long)psVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      pybind11_fail((string *)local_50);
    }
  }
  local_40._8_8_ = 0;
  local_50._8_8_ = scope.m_ptr;
  local_40._0_8_ = name;
  detail::accessor_policies::str_attr::set(scope,name,(this->super_object).super_handle.m_ptr);
  object::~object((object *)(local_40 + 8));
  if (local_c0 != &full_name._M_string_length) {
    operator_delete(local_c0,full_name._M_string_length + 1);
  }
  return;
}

Assistant:

exception(handle scope, const char *name, handle base = PyExc_Exception) {
        std::string full_name = scope.attr("__name__").cast<std::string>() +
                                std::string(".") + name;
        m_ptr = PyErr_NewException(const_cast<char *>(full_name.c_str()), base.ptr(), NULL);
        if (hasattr(scope, "__dict__") && scope.attr("__dict__").contains(name))
            pybind11_fail("Error during initialization: multiple incompatible "
                          "definitions with name \"" + std::string(name) + "\"");
        scope.attr(name) = *this;
    }